

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O2

optional<std::array<float,_4UL>_> * __thiscall
tinyusdz::primvar::PrimVar::get_value<std::array<float,4ul>>
          (optional<std::array<float,_4UL>_> *__return_storage_ptr__,PrimVar *this)

{
  bool bVar1;
  optional<std::array<float,_4UL>_> local_2c;
  
  bVar1 = is_blocked(this);
  if ((bVar1) || (bVar1 = has_value(this), !bVar1)) {
    __return_storage_ptr__->has_value_ = false;
    local_2c.contained.data.__align = (anon_struct_4_0_00000001_for___align)0x0;
    local_2c.contained._4_4_ = 0;
    local_2c.contained._8_4_ = 0;
    local_2c.contained._12_4_ = 0;
  }
  else {
    tinyusdz::value::Value::get_value<std::array<float,4ul>>(&local_2c,&this->_value,false);
    __return_storage_ptr__->has_value_ = local_2c.has_value_;
    if (local_2c.has_value_ != true) {
      return __return_storage_ptr__;
    }
  }
  *(undefined4 *)&__return_storage_ptr__->contained = local_2c.contained.data.__align;
  *(undefined4 *)((long)&__return_storage_ptr__->contained + 4) = local_2c.contained._4_4_;
  *(undefined4 *)((long)&__return_storage_ptr__->contained + 8) = local_2c.contained._8_4_;
  *(undefined4 *)((long)&__return_storage_ptr__->contained + 0xc) = local_2c.contained._12_4_;
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {

    if (is_blocked()) {
      return nonstd::nullopt;
    }

    if (!has_default()) {
      return nonstd::nullopt;
    }

    return _value.get_value<T>();
  }